

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QDBusMenuItem>::copyAppend
          (QGenericArrayOps<QDBusMenuItem> *this,QDBusMenuItem *b,QDBusMenuItem *e)

{
  QDBusMenuItem *pQVar1;
  QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
  *pQVar2;
  long lVar3;
  
  if (b != e) {
    pQVar1 = (this->super_QArrayDataPointer<QDBusMenuItem>).ptr;
    for (; b < e; b = b + 1) {
      lVar3 = (this->super_QArrayDataPointer<QDBusMenuItem>).size;
      pQVar1[lVar3].m_id = b->m_id;
      pQVar2 = (b->m_properties).d.d.ptr;
      pQVar1[lVar3].m_properties.d.d.ptr = pQVar2;
      if (pQVar2 != (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
                     *)0x0) {
        LOCK();
        (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value = (Type)((int)(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                               super_QBasicAtomicInteger<int>._q_value + 1);
        UNLOCK();
        lVar3 = (this->super_QArrayDataPointer<QDBusMenuItem>).size;
      }
      (this->super_QArrayDataPointer<QDBusMenuItem>).size = lVar3 + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }